

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::~XipFile(XipFile *this)

{
  uint uVar1;
  uint uVar2;
  uint32_t oldromhdr;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  reference pvVar9;
  pointer ppVar10;
  element_type *peVar11;
  size_type sVar12;
  undefined8 *puVar13;
  element_type *peVar14;
  undefined1 local_a8 [8];
  ReadWriter_ptr wrhdrptr;
  iterator iStack_80;
  uint32_t oldhdrrva;
  _Self local_78;
  iterator i_2;
  _Self local_68;
  iterator i_1;
  uint8_t *p;
  undefined1 local_50 [8];
  ByteVector hdr;
  _Self local_30;
  iterator i;
  size_t nummods;
  size_t numfiles;
  XipFile *this_local;
  
  (this->super_FileContainer)._vptr_FileContainer = (_func_int **)&PTR__XipFile_0019ba18;
  if ((this->_filelistmodified & 1U) != 0) {
    nummods = 0;
    i._M_node = (_Base_ptr)0x0;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
         ::begin(&this->_files);
    while( true ) {
      hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
                    ::end(&this->_files);
      bVar3 = std::operator!=(&local_30,
                              (_Self *)&hdr.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar3) break;
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
                ::operator->(&local_30);
      peVar11 = std::
                __shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar10->second);
      iVar4 = (*peVar11->_vptr_XipEntry[8])();
      if ((char)iVar4 == 'F') {
        nummods = nummods + 1;
      }
      else {
        i._M_node = (_Base_ptr)((long)&(i._M_node)->_M_color + 1);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
      ::operator++(&local_30);
    }
    (this->_hdr).nummods = (uint32_t)i._M_node;
    (this->_hdr).numfiles = (uint32_t)nummods;
    sVar6 = XipHeader::size();
    uVar1 = (this->_hdr).nummods;
    sVar7 = TocEntry::size();
    uVar2 = (this->_hdr).numfiles;
    sVar8 = FileEntry::size();
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&p + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
               sVar6 + uVar1 * sVar7 + uVar2 * sVar8,(allocator<unsigned_char> *)((long)&p + 7));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&p + 7));
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
    XipHeader::getdata(&this->_hdr,pvVar9);
    sVar6 = XipHeader::size();
    i_1._M_node = (_Base_ptr)
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,sVar6
                            );
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
         ::begin(&this->_files);
    while( true ) {
      i_2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
            ::end(&this->_files);
      bVar3 = std::operator!=(&local_68,&i_2);
      if (!bVar3) break;
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
                ::operator->(&local_68);
      peVar11 = std::
                __shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar10->second);
      iVar4 = (*peVar11->_vptr_XipEntry[8])();
      if ((char)iVar4 == 'M') {
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
                  ::operator->(&local_68);
        peVar11 = std::
                  __shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar10->second);
        (*peVar11->_vptr_XipEntry[2])(peVar11,i_1._M_node);
        sVar6 = TocEntry::size();
        i_1._M_node = (_Base_ptr)((long)&(i_1._M_node)->_M_color + sVar6);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
      ::operator++(&local_68);
    }
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
         ::begin(&this->_files);
    while( true ) {
      iStack_80 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
                  ::end(&this->_files);
      bVar3 = std::operator!=(&local_78,&stack0xffffffffffffff80);
      if (!bVar3) break;
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
                ::operator->(&local_78);
      peVar11 = std::
                __shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar10->second);
      iVar4 = (*peVar11->_vptr_XipEntry[8])();
      if ((char)iVar4 == 'F') {
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
                  ::operator->(&local_78);
        peVar11 = std::
                  __shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar10->second);
        (*peVar11->_vptr_XipEntry[2])(peVar11,i_1._M_node);
        sVar6 = FileEntry::size();
        i_1._M_node = (_Base_ptr)((long)&(i_1._M_node)->_M_color + sVar6);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
      ::operator++(&local_78);
    }
    oldromhdr = (this->_hdr).hdrrva;
    sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    uVar5 = allocmap::findfree(&this->_mm,(uint32_t)sVar12);
    (this->_hdr).hdrrva = uVar5;
    if ((this->_hdr).hdrrva == 0) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = "xip: could not alloc space for romhdr";
      __cxa_throw(puVar13,&char_const*::typeinfo,0);
    }
    uVar5 = (this->_hdr).hdrrva;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    getrvareader((XipFile *)
                 &wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (uint32_t)this,uVar5);
    peVar14 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
    sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    (*peVar14->_vptr_ReadWriter[3])(peVar14,pvVar9,sVar12);
    std::shared_ptr<ReadWriter>::~shared_ptr
              ((shared_ptr<ReadWriter> *)
               &wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    getrvareader((XipFile *)local_a8,(uint32_t)this,(this->_hdr).rvabase + 0x44);
    peVar14 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a8);
    ReadWriter::write32le(peVar14,(this->_hdr).hdrrva);
    peVar14 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a8);
    ReadWriter::write32le(peVar14,(this->_hdr).hdrrva - (this->_hdr).rvabase);
    update_romhdrptr_in_nk(this,oldromhdr,(this->_hdr).hdrrva);
    std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
  ::~map(&this->_files);
  allocmap::~allocmap(&this->_mm);
  std::shared_ptr<ReadWriter>::~shared_ptr(&this->_r);
  FileContainer::~FileContainer(&this->super_FileContainer);
  return;
}

Assistant:

~XipFile()
    {
        if (!_filelistmodified)
            return;

        size_t numfiles= 0;
        size_t nummods= 0;
        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
        {
            if (i->second->typechar()=='F')
                numfiles++;
            else
                nummods++;
        }
        _hdr.nummods= nummods;
        _hdr.numfiles= numfiles;

        ByteVector hdr(XipHeader::size()+_hdr.nummods*TocEntry::size()+_hdr.numfiles*FileEntry::size());

        _hdr.getdata(&hdr[0]);
        uint8_t *p= &hdr[XipHeader::size()];
        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
            if (i->second->typechar()=='M') {
                i->second->getentry(p);
                p += TocEntry::size();
            }

        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
            if (i->second->typechar()=='F') {
                i->second->getentry(p);
                p += FileEntry::size();
            }

        uint32_t oldhdrrva= _hdr.hdrrva;

        _hdr.hdrrva= _mm.findfree(hdr.size());
        if (_hdr.hdrrva==0)
            throw "xip: could not alloc space for romhdr";
        getrvareader(_hdr.hdrrva, hdr.size())->write(&hdr[0], hdr.size());

        ReadWriter_ptr wrhdrptr= getrvareader(_hdr.rvabase+0x44, 8);
        wrhdrptr->write32le(_hdr.hdrrva);
        wrhdrptr->write32le(_hdr.hdrrva-_hdr.rvabase);

        update_romhdrptr_in_nk(oldhdrrva, _hdr.hdrrva);
    }